

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int TPZFMatrix<double>::Substitution
              (double *ptr,int64_t rows,TPZFMatrix<double> *B,TPZVec<int> *index)

{
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  int64_t iVar8;
  double dVar9;
  TPZVec<double> v;
  
  if (B == (TPZFMatrix<double> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "static int TPZFMatrix<double>::Substitution(const TVar *, int64_t, TPZFMatrix<TVar> *, const TPZVec<int> &) [TVar = double]"
                            );
    poVar3 = std::operator<<(poVar3,"TPZFMatrix<>*B eh nulo");
  }
  else {
    if ((index->fNElements == rows) &&
       ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == rows)) {
      TPZVec<double>::TPZVec(&v,rows);
      piVar1 = index->fStore;
      lVar4 = 0;
      lVar2 = 0;
      if (0 < rows) {
        lVar2 = rows;
      }
      for (; lVar2 != lVar4; lVar4 = lVar4 + 1) {
        v.fStore[lVar4] = B->fElem[piVar1[lVar4]];
      }
      pdVar5 = ptr;
      for (lVar4 = 0; lVar4 != lVar2; lVar4 = lVar4 + 1) {
        dVar9 = 0.0;
        pdVar6 = pdVar5;
        for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
          dVar9 = dVar9 + *pdVar6 * v.fStore[lVar7];
          pdVar6 = pdVar6 + rows;
        }
        v.fStore[lVar4] = v.fStore[lVar4] - dVar9;
        pdVar5 = pdVar5 + 1;
      }
      pdVar5 = (double *)((long)ptr + (rows * 8 + 8) * rows + -8);
      iVar8 = rows;
      while (0 < iVar8) {
        lVar4 = iVar8 + -1;
        dVar9 = 0.0;
        pdVar6 = pdVar5;
        for (; iVar8 < rows; iVar8 = iVar8 + 1) {
          dVar9 = dVar9 + *pdVar6 * v.fStore[iVar8];
          pdVar6 = pdVar6 + rows;
        }
        v.fStore[lVar4] = (v.fStore[lVar4] - dVar9) / ptr[lVar4 * (rows + 1)];
        pdVar5 = (double *)((long)pdVar5 + (rows * 8 ^ 0xfffffffffffffff8U));
        iVar8 = lVar4;
      }
      for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
        B->fElem[lVar4] = v.fStore[lVar4];
      }
      TPZVec<double>::~TPZVec(&v);
      return 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2dfd0e);
    poVar3 = std::operator<<(poVar3,"this->fIndex = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,"  b = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B, const TPZVec<int> &index )
{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    
    
    if (index.NElements() != rows || b.Rows() != rows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t i,j;
    TVar sum = 0;
    
    TPZVec<TVar> v(rows);
    
    
    for (i=0;i<rows;i++)
    {
        v[i] = b(index[i]);
    }
    
    //Ly=b
    for (i=0;i<rows;i++)
    {
        sum = 0.;
        for (j=0;j<(i);j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] -= sum;
    }
    
    //Ux=y
    for (i=(rows-1);i>-1;i--)
    {
        sum = 0.;
        for (j=(i+1);j<rows;j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] = (v[i] - sum) / SELECTEL(ptr,rows,i,i);
    }
    
    for (i=0;i<rows;i++) b(i) = v[i];
    return 1;
}